

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TorsionStamp.cpp
# Opt level: O0

void __thiscall OpenMD::TorsionStamp::validate(TorsionStamp *this)

{
  bool bVar1;
  int data;
  ParamConstraintFacade<OpenMD::NonNegativeConstraint> *this_00;
  undefined8 uVar2;
  long in_RDI;
  undefined8 in_R9;
  DataHolder *in_stack_00000160;
  undefined1 *puVar3;
  undefined1 local_78 [32];
  string local_58 [48];
  NonNegativeConstraint local_28;
  
  DataHolder::validate(in_stack_00000160);
  bVar1 = ParameterBase::empty((ParameterBase *)(in_RDI + 0x68));
  if (!bVar1) {
    isNonNegative();
    data = Parameter<int>::getData((Parameter<int> *)(in_RDI + 0x68));
    bVar1 = NonNegativeConstraint::operator()(&local_28,data);
    NonNegativeConstraint::~NonNegativeConstraint((NonNegativeConstraint *)0x37649d);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_((ParameterBase *)(in_RDI + 0x68));
      this_00 = (ParamConstraintFacade<OpenMD::NonNegativeConstraint> *)
                std::__cxx11::string::c_str();
      puVar3 = local_78;
      isNonNegative();
      ParamConstraintFacade<OpenMD::NonNegativeConstraint>::getConstraintDescription_abi_cxx11_
                (this_00);
      uVar2 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",this_00,uVar2,in_R9,
               this_00,puVar3);
      std::__cxx11::string::~string(local_58);
      NonNegativeConstraint::~NonNegativeConstraint((NonNegativeConstraint *)0x376523);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  return;
}

Assistant:

void TorsionStamp::validate() {
    DataHolder::validate();
    CheckParameter(GhostVectorSource, isNonNegative());
  }